

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

SQInteger __thiscall
SQFunctionProto::GetLine(SQFunctionProto *this,SQInstruction *curr,int *hint,bool *is_line_op)

{
  SQLineInfo *pSVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  iVar6 = (int)this->_nlineinfos + -1;
  iVar2 = (int)((ulong)((long)curr + (-0xf8 - (long)this)) >> 3);
  if (hint != (int *)0x0) {
    iVar7 = *hint;
    lVar8 = (long)iVar7;
    if (iVar7 < iVar6) {
      pSVar1 = this->_lineinfos;
      if ((iVar2 <= pSVar1[lVar8]._op) || (pSVar1[lVar8 + 1]._op < iVar2)) {
        if (pSVar1[lVar8 + 1]._op + 1 != iVar2) {
          if (iVar2 == 0) {
            if (is_line_op != (bool *)0x0) {
              *is_line_op = SUB41((uint)*(undefined4 *)&pSVar1[lVar8].field_0x4 >> 0x1f,0);
            }
            uVar3 = *(uint *)&pSVar1->field_0x4;
            goto LAB_00131cd6;
          }
          goto LAB_00131c59;
        }
        lVar8 = lVar8 + 1;
        *hint = iVar7 + 1;
      }
      if (is_line_op != (bool *)0x0) {
        *is_line_op = SUB41((uint)*(undefined4 *)&pSVar1[lVar8].field_0x4 >> 0x1f,0);
      }
      uVar3 = *(uint *)&pSVar1[lVar8].field_0x4;
      goto LAB_00131cd6;
    }
  }
LAB_00131c59:
  pSVar1 = this->_lineinfos;
  iVar7 = 0;
  uVar3 = 0;
  while (iVar7 <= iVar6) {
    uVar3 = (iVar6 - iVar7 >> 1) + iVar7;
    lVar8 = (long)(int)uVar3;
    if (iVar2 < pSVar1[lVar8]._op) {
      iVar6 = uVar3 - 1;
    }
    else {
      if ((iVar2 <= pSVar1[lVar8]._op) ||
         ((lVar8 < this->_nlineinfos + -1 && (iVar2 <= pSVar1[lVar8 + 1]._op)))) break;
      iVar7 = uVar3 + 1;
    }
  }
  uVar4 = (int)uVar3 >> 0x1f & uVar3;
  while ((uVar5 = uVar4, 0 < (int)uVar3 && (uVar5 = uVar3, iVar2 <= pSVar1[uVar3]._op))) {
    uVar3 = uVar3 - 1;
  }
  uVar3 = *(uint *)&pSVar1[(int)uVar5].field_0x4;
  if (is_line_op != (bool *)0x0) {
    *is_line_op = SUB41(uVar3 >> 0x1f,0);
  }
  if (hint != (int *)0x0) {
    *hint = uVar5;
  }
LAB_00131cd6:
  return (ulong)(uVar3 & 0x7fffffff);
}

Assistant:

SQInteger SQFunctionProto::GetLine(SQInstruction *curr, int *hint, bool *is_line_op)
{
    int op = (int)(curr-_instructions);
    int high = _nlineinfos - 1;

    if (hint && *hint < high) {
        int pos = *hint;
        if (op > _lineinfos[pos]._op && op <= _lineinfos[pos + 1]._op) {
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[pos]._line;
        }
        if (op == _lineinfos[pos + 1]._op + 1) {
            *hint = ++pos;
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[pos]._line;
        }
        if (!op) {
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[0]._line;
        }
    }

    int line = 0;
    int low = 0;
    int mid = 0;
    while(low <= high)
    {
        mid = low + ((high - low) >> 1);
        int curop = _lineinfos[mid]._op;
        if(curop > op) {
            high = mid - 1;
        }
        else if(curop < op) {
            if(mid < (_nlineinfos - 1)
                && _lineinfos[mid + 1]._op >= op) {
                break;
            }
            low = mid + 1;
        }
        else { //equal
            break;
        }
    }

    while(mid > 0 && _lineinfos[mid]._op >= op) mid--;

    line = _lineinfos[mid]._line;

    if (is_line_op)
        *is_line_op = _lineinfos[mid]._is_line_op;

    if (hint)
        *hint = mid;

    return line;
}